

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddFrameworkItem(cmComputeLinkInformation *this,string *item)

{
  Snapshot snapshot;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  string *psVar4;
  Item local_300;
  string local_2d0;
  Snapshot local_2b0;
  undefined1 local_298 [8];
  cmOutputConverter converter;
  string local_270;
  Item local_250;
  undefined1 local_220 [8];
  string full_fw;
  string fw;
  string fw_path;
  ostringstream local_190 [8];
  ostringstream e;
  string *item_local;
  cmComputeLinkInformation *this_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::RegularExpression::find(&this->SplitFramework,pcVar2);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_
              ((string *)((long)&fw.field_2 + 8),&this->SplitFramework,1);
    cmsys::RegularExpression::match_abi_cxx11_
              ((string *)((long)&full_fw.field_2 + 8),&this->SplitFramework,2);
    std::__cxx11::string::string((string *)local_220,(string *)(fw.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_220,"/");
    std::__cxx11::string::operator+=
              ((string *)local_220,(string *)(full_fw.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_220,".framework");
    std::__cxx11::string::operator+=((string *)local_220,"/");
    std::__cxx11::string::operator+=
              ((string *)local_220,(string *)(full_fw.field_2._M_local_buf + 8));
    AddFrameworkPath(this,(string *)((long)&fw.field_2 + 8));
    AddLibraryRuntimeInfo(this,(string *)local_220);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_270,"-framework",(allocator *)&converter.field_0x1f);
    Item::Item(&local_250,&local_270,false,(cmTarget *)0x0);
    std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
    push_back(&this->Items,&local_250);
    Item::~Item(&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)&converter.field_0x1f);
    cmMakefile::GetStateSnapshot(&local_2b0,this->Makefile);
    snapshot.Position.Tree = local_2b0.Position.Tree;
    snapshot.State = local_2b0.State;
    snapshot.Position.Position = local_2b0.Position.Position;
    cmOutputConverter::cmOutputConverter((cmOutputConverter *)local_298,snapshot);
    cmOutputConverter::EscapeForShell
              (&local_2d0,(cmOutputConverter *)local_298,(string *)((long)&full_fw.field_2 + 8),
               false,false,false);
    std::__cxx11::string::operator=
              ((string *)(full_fw.field_2._M_local_buf + 8),(string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    Item::Item(&local_300,(string *)(full_fw.field_2._M_local_buf + 8),false,(cmTarget *)0x0);
    std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
    push_back(&this->Items,&local_300);
    Item::~Item(&local_300);
    std::__cxx11::string::~string((string *)local_220);
    std::__cxx11::string::~string((string *)(full_fw.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(fw.field_2._M_local_buf + 8));
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar3 = std::operator<<((ostream *)local_190,"Could not parse framework path \"");
    poVar3 = std::operator<<(poVar3,(string *)item);
    poVar3 = std::operator<<(poVar3,"\" ");
    poVar3 = std::operator<<(poVar3,"linked by target ");
    psVar4 = cmTarget::GetName_abi_cxx11_(this->Target);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::operator<<(poVar3,".");
    std::__cxx11::ostringstream::str();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error(pcVar2,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string((string *)(fw_path.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddFrameworkItem(std::string const& item)
{
  // Try to separate the framework name and path.
  if(!this->SplitFramework.find(item.c_str()))
    {
    std::ostringstream e;
    e << "Could not parse framework path \"" << item << "\" "
      << "linked by target " << this->Target->GetName() << ".";
    cmSystemTools::Error(e.str().c_str());
    return;
    }

  std::string fw_path = this->SplitFramework.match(1);
  std::string fw = this->SplitFramework.match(2);
  std::string full_fw = fw_path;
  full_fw += "/";
  full_fw += fw;
  full_fw += ".framework";
  full_fw += "/";
  full_fw += fw;

  // Add the directory portion to the framework search path.
  this->AddFrameworkPath(fw_path);

  // add runtime information
  this->AddLibraryRuntimeInfo(full_fw);

  // Add the item using the -framework option.
  this->Items.push_back(Item("-framework", false));
  cmOutputConverter converter(this->Makefile->GetStateSnapshot());
  fw = converter.EscapeForShell(fw);
  this->Items.push_back(Item(fw, false));
}